

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assetsys.h
# Opt level: O3

mz_bool mz_zip_writer_add_mem_ex
                  (mz_zip_archive *pZip,char *pArchive_name,void *pBuf,size_t buf_size,
                  void *pComment,mz_uint16 comment_size,mz_uint level_and_flags,
                  mz_uint64 uncomp_size,mz_uint32 uncomp_crc32)

{
  long lVar1;
  mz_uint mVar2;
  mz_zip_internal_state *pArray;
  mz_uint16 method;
  mz_uint16 mVar3;
  tdefl_compressor *d;
  void *pvVar4;
  char cVar5;
  undefined1 uVar6;
  mz_bool mVar7;
  tdefl_status tVar8;
  size_t sVar9;
  char *pcVar10;
  ulong min_new_capacity;
  ulong uVar11;
  size_t sVar12;
  ushort uVar13;
  uint uVar14;
  uint uVar15;
  byte bVar16;
  mz_uint64 mVar17;
  undefined8 uVar18;
  size_t sVar19;
  uint uVar20;
  mz_uint16 dos_date_00;
  mz_uint64 in_stack_ffffffffffffef48;
  mz_uint32 in_stack_ffffffffffffef50;
  ulong local_10a8;
  mz_uint16 dos_date;
  mz_uint16 dos_time;
  ulong local_1098;
  tdefl_compressor *local_1090;
  size_t local_1088;
  char *local_1080;
  void *local_1078;
  mz_ulong local_1070;
  mz_uint8 *local_1068;
  mz_uint64 local_1060;
  ulong local_1058;
  ulong local_1050;
  undefined8 local_1048;
  void *local_1040;
  time_t cur_time;
  undefined8 local_1030;
  undefined8 local_1028;
  undefined1 local_1020;
  undefined1 local_101f;
  undefined1 local_101e;
  undefined1 local_101d;
  undefined2 local_101c;
  
  dos_time = 0;
  dos_date = 0;
  uVar14 = 6;
  if (-1 < (int)level_and_flags) {
    uVar14 = level_and_flags;
  }
  uVar20 = uVar14 & 0xf;
  pArray = pZip->m_pState;
  if (pArray == (mz_zip_internal_state *)0x0) {
    return 0;
  }
  if (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) {
    return 0;
  }
  if (pArchive_name == (char *)0x0) {
    return 0;
  }
  if (pBuf == (void *)0x0 && buf_size != 0) {
    return 0;
  }
  if (pComment == (void *)0x0 && comment_size != 0) {
    return 0;
  }
  if (10 < uVar20) {
    return 0;
  }
  if (pZip->m_total_files == 0xffff) {
    return 0;
  }
  uVar14 = uVar14 & 0x400;
  local_1078 = (void *)uncomp_size;
  local_1098 = uncomp_size | buf_size;
  if (local_1098 >> 0x20 != 0) {
    return 0;
  }
  if (uncomp_size != 0 && uVar14 == 0) {
    return 0;
  }
  cVar5 = *pArchive_name;
  if (cVar5 == '/') {
    return 0;
  }
  local_1070 = (mz_ulong)uncomp_crc32;
  local_1060 = pZip->m_archive_size;
  bVar16 = uVar20 == 0 | (byte)(uVar14 >> 10);
  pcVar10 = pArchive_name + 1;
  while (cVar5 != '\0') {
    if (cVar5 == ':') {
      return 0;
    }
    if (cVar5 == '\\') {
      return 0;
    }
    cVar5 = *pcVar10;
    pcVar10 = pcVar10 + 1;
  }
  local_1080 = pArchive_name;
  local_1068 = (mz_uint8 *)pBuf;
  local_1040 = pComment;
  time(&cur_time);
  mz_zip_time_to_dos_time(cur_time,&dos_time,&dos_date);
  local_1088 = strlen(local_1080);
  if (0xffff < local_1088) {
    return 0;
  }
  mVar2 = pZip->m_file_offset_alignment;
  if (mVar2 == 0) {
    uVar15 = 0;
  }
  else {
    uVar15 = mVar2 - ((uint)pZip->m_archive_size & mVar2 - 1) & mVar2 - 1;
  }
  uVar11 = (ulong)uVar15;
  if (pZip->m_total_files == 0xffff) {
    return 0;
  }
  lVar1 = comment_size + local_1088;
  if (pZip->m_archive_size + lVar1 + uVar11 + 0x4c >> 0x20 != 0) {
    return 0;
  }
  uVar18 = 0;
  if ((local_1088 != 0) && (local_1080[local_1088 - 1] == '/')) {
    if (local_1098 != 0) {
      return 0;
    }
    uVar18 = 0x10;
  }
  min_new_capacity = (pArray->m_central_dir).m_size + lVar1 + 0x2e;
  local_1098 = uVar11;
  if (((min_new_capacity <= (pArray->m_central_dir).m_capacity) ||
      (mVar7 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,min_new_capacity,1),
      mVar7 != 0)) &&
     ((uVar11 = (pArray->m_central_dir_offsets).m_size + 1, local_1048 = uVar18,
      uVar11 <= (pArray->m_central_dir_offsets).m_capacity ||
      (mVar7 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir_offsets,uVar11,1),
      mVar7 != 0)))) {
    if (buf_size == 0 || bVar16 != 0) {
      local_1090 = (tdefl_compressor *)0x0;
    }
    else {
      local_1090 = (tdefl_compressor *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,0x4df78);
      if (local_1090 == (tdefl_compressor *)0x0) {
        return 0;
      }
    }
    uVar11 = local_1098 + 0x1e;
    sVar12 = 0x1000;
    if ((uint)uVar11 < 0x1000) {
      sVar12 = uVar11 & 0xffffffff;
    }
    local_1058 = (ulong)comment_size;
    memset(&cur_time,0,sVar12);
    mVar17 = local_1060;
    local_1050 = uVar11;
    do {
      sVar12 = local_1088;
      uVar15 = (uint)uVar11;
      if (uVar15 == 0) {
        local_1098 = local_1098 + local_1060;
        if ((pZip->m_file_offset_alignment != 0) &&
           (((uint)local_1098 & pZip->m_file_offset_alignment - 1) != 0)) {
          __assert_fail("(local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/mattiasgustavsson_libs/assetsys.h"
                        ,0x1290,
                        "mz_bool mz_zip_writer_add_mem_ex(mz_zip_archive *, const char *, const void *, size_t, const void *, mz_uint16, mz_uint, mz_uint64, mz_uint32)"
                       );
        }
        mVar17 = local_1050 + local_1060;
        sVar19 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar17,local_1080,local_1088);
        if (sVar19 != sVar12) break;
        mVar17 = mVar17 + sVar12;
        pvVar4 = local_1078;
        if ((uVar14 == 0) &&
           (local_1070 = mz_crc32(0,local_1068,buf_size), d = local_1090, pvVar4 = (void *)buf_size,
           (3 < buf_size & (bVar16 ^ 1)) != 0)) {
          local_1028 = 0;
          cur_time = (time_t)pZip;
          local_1030 = mVar17;
          tdefl_init(local_1090,mz_zip_writer_add_put_buf_callback,&cur_time,
                     (uint)(uVar20 < 4) << 0xe |
                     tdefl_write_image_to_png_file_in_memory_ex::s_tdefl_png_num_probes[uVar20]);
          tVar8 = tdefl_compress_buffer(d,local_1068,buf_size,TDEFL_FINISH);
          if (tVar8 != TDEFL_STATUS_DONE) break;
          uVar13 = 8;
          local_10a8 = local_1028;
          uVar11 = local_1030;
          local_1078 = (void *)buf_size;
        }
        else {
          local_1078 = pvVar4;
          sVar19 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar17,local_1068,buf_size);
          if (sVar19 != buf_size) break;
          uVar13 = (ushort)(uVar14 >> 7);
          uVar11 = mVar17 + buf_size;
          local_10a8 = buf_size;
        }
        (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_1090);
        mVar3 = dos_time;
        method = dos_date;
        if (local_10a8 >> 0x20 != 0) {
          return 0;
        }
        if (uVar11 >> 0x20 == 0) {
          uVar6 = 0x14;
          if (uVar13 == 0) {
            uVar6 = 0;
          }
          cur_time = (time_t)CONCAT14(uVar6,0x4034b50);
          local_1030 = CONCAT17((char)(local_1070 >> 8),
                                CONCAT16((char)local_1070,
                                         CONCAT15((char)(dos_date >> 8),
                                                  CONCAT14((char)dos_date,
                                                           CONCAT13((char)(dos_time >> 8),
                                                                    CONCAT12((char)dos_time,uVar13))
                                                          ))));
          local_1028 = CONCAT17((char)((ulong)local_1078 >> 8),
                                CONCAT16((char)local_1078,
                                         CONCAT15((char)(local_10a8 >> 0x18),
                                                  CONCAT14((char)(local_10a8 >> 0x10),
                                                           CONCAT13((char)(local_10a8 >> 8),
                                                                    CONCAT12((char)local_10a8,
                                                                             (short)(local_1070 >>
                                                                                    0x10)))))));
          local_1020 = (undefined1)((ulong)local_1078 >> 0x10);
          local_101f = (undefined1)((ulong)local_1078 >> 0x18);
          local_101e = (undefined1)local_1088;
          local_101d = (undefined1)(local_1088 >> 8);
          local_101c = 0;
          dos_date_00 = 0xbdf7;
          sVar19 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_1098,&cur_time,0x1e);
          if (sVar19 == 0x1e) {
            mVar7 = mz_zip_writer_add_to_central_dir
                              (pZip,local_1080,(mz_uint16)local_1088,local_1040,
                               (mz_uint16)local_1058,local_1078,(mz_uint16)local_10a8,local_1070,
                               (ulong)uVar13,(uint)mVar3,method,(mz_uint16)local_1098,
                               (mz_uint16)local_1048,dos_date_00,in_stack_ffffffffffffef48,
                               in_stack_ffffffffffffef50);
            if (mVar7 != 0) {
              pZip->m_total_files = pZip->m_total_files + 1;
              pZip->m_archive_size = uVar11;
              return 1;
            }
            return 0;
          }
          return 0;
        }
        return 0;
      }
      sVar19 = 0x1000;
      if (uVar15 < 0x1000) {
        sVar19 = uVar11 & 0xffffffff;
      }
      sVar9 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar17,&cur_time,sVar19);
      mVar17 = mVar17 + sVar19;
      uVar11 = (ulong)(uVar15 - (int)sVar19);
    } while (sVar9 == sVar19);
    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_1090);
  }
  return 0;
}

Assistant:

mz_bool mz_zip_writer_add_mem_ex(mz_zip_archive *pZip, const char *pArchive_name, const void *pBuf, size_t buf_size, const void *pComment, mz_uint16 comment_size, mz_uint level_and_flags, mz_uint64 uncomp_size, mz_uint32 uncomp_crc32)
{
  mz_uint16 method = 0, dos_time = 0, dos_date = 0;
  mz_uint level, ext_attributes = 0, num_alignment_padding_bytes;
  mz_uint64 local_dir_header_ofs = pZip->m_archive_size, cur_archive_file_ofs = pZip->m_archive_size, comp_size = 0;
  size_t archive_name_size;
  mz_uint8 local_dir_header[MZ_ZIP_LOCAL_DIR_HEADER_SIZE];
  tdefl_compressor *pComp = NULL;
  mz_bool store_data_uncompressed;
  mz_zip_internal_state *pState;

  if ((int)level_and_flags < 0)
    level_and_flags = MZ_DEFAULT_LEVEL;
  level = level_and_flags & 0xF;
  store_data_uncompressed = ((!level) || (level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA));

  if ((!pZip) || (!pZip->m_pState) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) || ((buf_size) && (!pBuf)) || (!pArchive_name) || ((comment_size) && (!pComment)) || (pZip->m_total_files == 0xFFFF) || (level > MZ_UBER_COMPRESSION))
    return MZ_FALSE;

  pState = pZip->m_pState;

  if ((!(level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) && (uncomp_size))
    return MZ_FALSE;
  // No zip64 support yet
  if ((buf_size > 0xFFFFFFFF) || (uncomp_size > 0xFFFFFFFF))
    return MZ_FALSE;
  if (!mz_zip_writer_validate_archive_name(pArchive_name))
    return MZ_FALSE;

#ifndef MINIZ_NO_TIME
  {
    time_t cur_time; time(&cur_time);
    mz_zip_time_to_dos_time(cur_time, &dos_time, &dos_date);
  }
#endif // #ifndef MINIZ_NO_TIME

  archive_name_size = strlen(pArchive_name);
  if (archive_name_size > 0xFFFF)
    return MZ_FALSE;

  num_alignment_padding_bytes = mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);

  // no zip64 support yet
  if ((pZip->m_total_files == 0xFFFF) || ((pZip->m_archive_size + num_alignment_padding_bytes + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + comment_size + archive_name_size) > 0xFFFFFFFF))
    return MZ_FALSE;

  if ((archive_name_size) && (pArchive_name[archive_name_size - 1] == '/'))
  {
    // Set DOS Subdirectory attribute bit.
    ext_attributes |= 0x10;
    // Subdirectories cannot contain data.
    if ((buf_size) || (uncomp_size))
      return MZ_FALSE;
  }

  // Try to do any allocations before writing to the archive, so if an allocation fails the file remains unmodified. (A good idea if we're doing an in-place modification.)
  if ((!mz_zip_array_ensure_room(pZip, &pState->m_central_dir, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + archive_name_size + comment_size)) || (!mz_zip_array_ensure_room(pZip, &pState->m_central_dir_offsets, 1)))
    return MZ_FALSE;

  if ((!store_data_uncompressed) && (buf_size))
  {
    if (NULL == (pComp = (tdefl_compressor *)pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, sizeof(tdefl_compressor))))
      return MZ_FALSE;
  }

  if (!mz_zip_writer_write_zeros(pZip, cur_archive_file_ofs, num_alignment_padding_bytes + sizeof(local_dir_header)))
  {
    pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
    return MZ_FALSE;
  }
  local_dir_header_ofs += num_alignment_padding_bytes;
  if (pZip->m_file_offset_alignment) { MZ_ASSERT((local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0); }
  cur_archive_file_ofs += num_alignment_padding_bytes + sizeof(local_dir_header);

  MZ_CLEAR_OBJ(local_dir_header);
  if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pArchive_name, archive_name_size) != archive_name_size)
  {
    pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
    return MZ_FALSE;
  }
  cur_archive_file_ofs += archive_name_size;

  if (!(level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA))
  {
    uncomp_crc32 = (mz_uint32)mz_crc32(MZ_CRC32_INIT, (const mz_uint8*)pBuf, buf_size);
    uncomp_size = buf_size;
    if (uncomp_size <= 3)
    {
      level = 0;
      store_data_uncompressed = MZ_TRUE;
    }
  }

  if (store_data_uncompressed)
  {
    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pBuf, buf_size) != buf_size)
    {
      pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
      return MZ_FALSE;
    }

    cur_archive_file_ofs += buf_size;
    comp_size = buf_size;

    if (level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)
      method = MZ_DEFLATED;
  }
  else if (buf_size)
  {
    mz_zip_writer_add_state state;

    state.m_pZip = pZip;
    state.m_cur_archive_file_ofs = cur_archive_file_ofs;
    state.m_comp_size = 0;

    if ((tdefl_init(pComp, mz_zip_writer_add_put_buf_callback, &state, tdefl_create_comp_flags_from_zip_params(level, -15, MZ_DEFAULT_STRATEGY)) != TDEFL_STATUS_OKAY) ||
        (tdefl_compress_buffer(pComp, pBuf, buf_size, TDEFL_FINISH) != TDEFL_STATUS_DONE))
    {
      pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
      return MZ_FALSE;
    }

    comp_size = state.m_comp_size;
    cur_archive_file_ofs = state.m_cur_archive_file_ofs;

    method = MZ_DEFLATED;
  }

  pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
  pComp = NULL;

  // no zip64 support yet
  if ((comp_size > 0xFFFFFFFF) || (cur_archive_file_ofs > 0xFFFFFFFF))
    return MZ_FALSE;

  if (!mz_zip_writer_create_local_dir_header(pZip, local_dir_header, (mz_uint16)archive_name_size, 0, uncomp_size, comp_size, uncomp_crc32, method, 0, dos_time, dos_date))
    return MZ_FALSE;

  if (pZip->m_pWrite(pZip->m_pIO_opaque, local_dir_header_ofs, local_dir_header, sizeof(local_dir_header)) != sizeof(local_dir_header))
    return MZ_FALSE;

  if (!mz_zip_writer_add_to_central_dir(pZip, pArchive_name, (mz_uint16)archive_name_size, NULL, 0, pComment, comment_size, uncomp_size, comp_size, uncomp_crc32, method, 0, dos_time, dos_date, local_dir_header_ofs, ext_attributes))
    return MZ_FALSE;

  pZip->m_total_files++;
  pZip->m_archive_size = cur_archive_file_ofs;

  return MZ_TRUE;
}